

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__decode_samples_with_residual
                    (ma_dr_flac_bs *bs,ma_uint32 bitsPerSample,ma_uint32 blockSize,
                    ma_uint32 lpcOrder,ma_int32 lpcShift,ma_uint32 lpcPrecision,
                    ma_int32 *coefficients,ma_int32 *pDecodedSamples)

{
  ma_uint8 mVar1;
  ma_bool32 mVar2;
  long lVar3;
  int iVar4;
  ma_int32 *pSamplesOut;
  ulong uVar5;
  long lVar6;
  undefined4 in_register_00000034;
  uint uVar7;
  uint count;
  ulong uVar8;
  bool bVar9;
  ma_uint8 riceParam;
  ma_uint8 unencodedBitsPerSample;
  ma_uint8 partitionOrder;
  ma_uint8 residualMethod;
  int local_70;
  uint local_6c;
  ma_dr_flac_bs *local_68;
  ma_uint32 local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  undefined8 local_48;
  ulong local_40;
  long local_38;
  
  local_48 = CONCAT44(in_register_00000034,bitsPerSample);
  uVar8 = (ulong)lpcPrecision;
  uVar5 = (ulong)lpcOrder;
  local_6c = lpcShift;
  local_68 = bs;
  local_60 = blockSize;
  mVar2 = ma_dr_flac__read_uint8(bs,2,&residualMethod);
  if ((((mVar2 != 0) && (residualMethod < 2)) &&
      (mVar2 = ma_dr_flac__read_uint8(local_68,4,&partitionOrder), mVar2 != 0)) &&
     ((partitionOrder < 9 &&
      (uVar7 = local_60 >> (partitionOrder & 0x1f), count = uVar7 - lpcOrder, lpcOrder <= uVar7))))
  {
    local_70 = 1 << (partitionOrder & 0x1f);
    pSamplesOut = pDecodedSamples + uVar5;
    uVar7 = 0x1f;
    if (lpcOrder != 0) {
      for (; lpcOrder >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    iVar4 = (uVar7 ^ 0xffffffe0) + 0x21;
    if (lpcOrder == 0) {
      iVar4 = 0;
    }
    local_40 = (ulong)local_6c;
    local_5c = iVar4 + (int)local_48 + lpcPrecision;
    local_58 = uVar5;
    local_50 = uVar8;
    do {
      riceParam = '\0';
      if (residualMethod == '\x01') {
        mVar2 = ma_dr_flac__read_uint8(local_68,5,&riceParam);
        if (mVar2 != 0) {
          bVar9 = riceParam == '\x1f';
LAB_00169699:
          if (bVar9) {
            riceParam = 0xff;
          }
          goto LAB_001696a8;
        }
LAB_00169b3a:
        mVar2 = 0;
      }
      else {
        if (residualMethod == '\0') {
          mVar2 = ma_dr_flac__read_uint8(local_68,4,&riceParam);
          if (mVar2 != 0) {
            bVar9 = riceParam == '\x0f';
            goto LAB_00169699;
          }
          goto LAB_00169b3a;
        }
LAB_001696a8:
        if (riceParam == 0xff) {
          unencodedBitsPerSample = '\0';
          mVar2 = ma_dr_flac__read_uint8(local_68,5,&unencodedBitsPerSample);
          mVar1 = unencodedBitsPerSample;
          if (mVar2 == 0) goto LAB_00169b3a;
          uVar5 = local_58;
          uVar8 = local_50;
          if (count != 0) {
            uVar7 = (uint)unencodedBitsPerSample;
            local_38 = (ulong)count << 2;
            lVar6 = 0;
            do {
              if (mVar1 == '\0') {
                *(ma_int32 *)((long)pSamplesOut + lVar6) = 0;
              }
              else {
                mVar2 = ma_dr_flac__read_int32
                                  (local_68,uVar7,(ma_int32 *)((long)pSamplesOut + lVar6));
                if (mVar2 == 0) {
                  mVar2 = 0;
                  uVar5 = local_58;
                  uVar8 = local_50;
                  goto LAB_00169b59;
                }
              }
              if (local_5c < 0x21) {
                iVar4 = 0;
                switch(lpcOrder - 1) {
                case 0x1f:
                  iVar4 = *(int *)((long)pSamplesOut + lVar6 + -0x80) * coefficients[0x1f];
                case 0x1e:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x7c) * coefficients[0x1e];
                case 0x1d:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x78) * coefficients[0x1d];
                case 0x1c:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x74) * coefficients[0x1c];
                case 0x1b:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x70) * coefficients[0x1b];
                case 0x1a:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x6c) * coefficients[0x1a];
                case 0x19:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x68) * coefficients[0x19];
                case 0x18:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -100) * coefficients[0x18];
                case 0x17:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x60) * coefficients[0x17];
                case 0x16:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x5c) * coefficients[0x16];
                case 0x15:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x58) * coefficients[0x15];
                case 0x14:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x54) * coefficients[0x14];
                case 0x13:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x50) * coefficients[0x13];
                case 0x12:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x4c) * coefficients[0x12];
                case 0x11:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x48) * coefficients[0x11];
                case 0x10:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x44) * coefficients[0x10];
                case 0xf:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x40) * coefficients[0xf];
                case 0xe:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x3c) * coefficients[0xe];
                case 0xd:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x38) * coefficients[0xd];
                case 0xc:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x34) * coefficients[0xc];
                case 0xb:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x30) * coefficients[0xb];
                case 10:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x2c) * coefficients[10];
                case 9:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x28) * coefficients[9];
                case 8:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x24) * coefficients[8];
                case 7:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x20) * coefficients[7];
                case 6:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x1c) * coefficients[6];
                case 5:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x18) * coefficients[5];
                case 4:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x14) * coefficients[4];
                case 3:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0x10) * coefficients[3];
                case 2:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -0xc) * coefficients[2];
                case 1:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -8) * coefficients[1];
                case 0:
                  iVar4 = iVar4 + *(int *)((long)pSamplesOut + lVar6 + -4) * *coefficients;
                default:
                  iVar4 = iVar4 >> ((byte)local_6c & 0x1f);
                }
              }
              else {
                lVar3 = 0;
                switch(lpcOrder - 1) {
                case 0x1f:
                  lVar3 = (long)*(int *)((long)pSamplesOut + lVar6 + -0x80) *
                          (long)coefficients[0x1f];
                case 0x1e:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x7c) *
                                  (long)coefficients[0x1e];
                case 0x1d:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x78) *
                                  (long)coefficients[0x1d];
                case 0x1c:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x74) *
                                  (long)coefficients[0x1c];
                case 0x1b:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x70) *
                                  (long)coefficients[0x1b];
                case 0x1a:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x6c) *
                                  (long)coefficients[0x1a];
                case 0x19:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x68) *
                                  (long)coefficients[0x19];
                case 0x18:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -100) *
                                  (long)coefficients[0x18];
                case 0x17:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x60) *
                                  (long)coefficients[0x17];
                case 0x16:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x5c) *
                                  (long)coefficients[0x16];
                case 0x15:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x58) *
                                  (long)coefficients[0x15];
                case 0x14:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x54) *
                                  (long)coefficients[0x14];
                case 0x13:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x50) *
                                  (long)coefficients[0x13];
                case 0x12:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x4c) *
                                  (long)coefficients[0x12];
                case 0x11:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x48) *
                                  (long)coefficients[0x11];
                case 0x10:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x44) *
                                  (long)coefficients[0x10];
                case 0xf:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x40) *
                                  (long)coefficients[0xf];
                case 0xe:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x3c) *
                                  (long)coefficients[0xe];
                case 0xd:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x38) *
                                  (long)coefficients[0xd];
                case 0xc:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x34) *
                                  (long)coefficients[0xc];
                case 0xb:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x30) *
                                  (long)coefficients[0xb];
                case 10:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x2c) *
                                  (long)coefficients[10];
                case 9:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x28) *
                                  (long)coefficients[9];
                case 8:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x24) *
                                  (long)coefficients[8];
                case 7:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x20) *
                                  (long)coefficients[7];
                case 6:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x1c) *
                                  (long)coefficients[6];
                case 5:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x18) *
                                  (long)coefficients[5];
                case 4:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x14) *
                                  (long)coefficients[4];
                case 3:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0x10) *
                                  (long)coefficients[3];
                case 2:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -0xc) *
                                  (long)coefficients[2];
                case 1:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -8) *
                                  (long)coefficients[1];
                case 0:
                  lVar3 = lVar3 + (long)*(int *)((long)pSamplesOut + lVar6 + -4) *
                                  (long)*coefficients;
                default:
                  iVar4 = (int)(lVar3 >> ((byte)local_40 & 0x3f));
                }
              }
              *(int *)((long)pSamplesOut + lVar6) = *(int *)((long)pSamplesOut + lVar6) + iVar4;
              lVar6 = lVar6 + 4;
              uVar5 = local_58;
              uVar8 = local_50;
            } while (local_38 != lVar6);
          }
LAB_00169b1e:
          pSamplesOut = pSamplesOut + count;
          if (local_70 == 1) {
            local_70 = 1;
            goto LAB_00169b36;
          }
          local_70 = local_70 + -1;
          uVar7 = local_60 >> (partitionOrder & 0x1f);
          if (partitionOrder != '\0') {
            count = uVar7;
          }
          mVar2 = (ma_bool32)CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
        }
        else {
          mVar2 = ma_dr_flac__decode_samples_with_residual__rice__scalar
                            (local_68,(ma_uint32)local_48,count,riceParam,(ma_uint32)uVar5,local_6c,
                             (ma_uint32)uVar8,coefficients,pSamplesOut);
          if (mVar2 != 0) goto LAB_00169b1e;
LAB_00169b36:
          mVar2 = 0;
        }
      }
LAB_00169b59:
    } while ((char)mVar2 != '\0');
  }
  return mVar2;
}

Assistant:

static ma_bool32 ma_dr_flac__decode_samples_with_residual(ma_dr_flac_bs* bs, ma_uint32 bitsPerSample, ma_uint32 blockSize, ma_uint32 lpcOrder, ma_int32 lpcShift, ma_uint32 lpcPrecision, const ma_int32* coefficients, ma_int32* pDecodedSamples)
{
    ma_uint8 residualMethod;
    ma_uint8 partitionOrder;
    ma_uint32 samplesInPartition;
    ma_uint32 partitionsRemaining;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(blockSize != 0);
    MA_DR_FLAC_ASSERT(pDecodedSamples != NULL);
    if (!ma_dr_flac__read_uint8(bs, 2, &residualMethod)) {
        return MA_FALSE;
    }
    if (residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE && residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
        return MA_FALSE;
    }
    pDecodedSamples += lpcOrder;
    if (!ma_dr_flac__read_uint8(bs, 4, &partitionOrder)) {
        return MA_FALSE;
    }
    if (partitionOrder > 8) {
        return MA_FALSE;
    }
    if ((blockSize / (1 << partitionOrder)) < lpcOrder) {
        return MA_FALSE;
    }
    samplesInPartition = (blockSize / (1 << partitionOrder)) - lpcOrder;
    partitionsRemaining = (1 << partitionOrder);
    for (;;) {
        ma_uint8 riceParam = 0;
        if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE) {
            if (!ma_dr_flac__read_uint8(bs, 4, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 15) {
                riceParam = 0xFF;
            }
        } else if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
            if (!ma_dr_flac__read_uint8(bs, 5, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 31) {
                riceParam = 0xFF;
            }
        }
        if (riceParam != 0xFF) {
            if (!ma_dr_flac__decode_samples_with_residual__rice(bs, bitsPerSample, samplesInPartition, riceParam, lpcOrder, lpcShift, lpcPrecision, coefficients, pDecodedSamples)) {
                return MA_FALSE;
            }
        } else {
            ma_uint8 unencodedBitsPerSample = 0;
            if (!ma_dr_flac__read_uint8(bs, 5, &unencodedBitsPerSample)) {
                return MA_FALSE;
            }
            if (!ma_dr_flac__decode_samples_with_residual__unencoded(bs, bitsPerSample, samplesInPartition, unencodedBitsPerSample, lpcOrder, lpcShift, lpcPrecision, coefficients, pDecodedSamples)) {
                return MA_FALSE;
            }
        }
        pDecodedSamples += samplesInPartition;
        if (partitionsRemaining == 1) {
            break;
        }
        partitionsRemaining -= 1;
        if (partitionOrder != 0) {
            samplesInPartition = blockSize / (1 << partitionOrder);
        }
    }
    return MA_TRUE;
}